

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void Hex::Hexdumper<unsigned_short>::output_bin(ostream *os,remove_const_t<unsigned_short> val)

{
  ostream *poVar1;
  int iVar2;
  ostream oVar3;
  ushort uVar4;
  int iVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char bits [257];
  char acStack_13a [274];
  
  uVar9 = 0;
  uVar6 = CONCAT62(in_register_00000032,val);
  if ((int)CONCAT62(in_register_00000032,val) != 0) {
    do {
      acStack_13a[uVar9 + 2] = (byte)(uVar6 & 0xffff) & 1 | 0x30;
      uVar9 = uVar9 + 1;
      uVar4 = (ushort)uVar6;
      uVar6 = (uVar6 & 0xffff) >> 1;
    } while (1 < uVar4);
  }
  iVar8 = (int)uVar9;
  acStack_13a[(uVar9 & 0xffffffff) + 2] = '\0';
  lVar7 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar7;
  iVar2 = *(int *)(os + lVar7 + 0x10);
  if (os[lVar7 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar3;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar5 = iVar2 - iVar8;
  if (iVar5 == 0 || iVar2 < iVar8) {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  else {
    acStack_13a[1] = ' ';
    if ((char)*(undefined4 *)(poVar1 + 0xe0) != '\0') {
      acStack_13a[1] = (char)*(undefined4 *)(poVar1 + 0xe0);
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)iVar5;
    std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
  }
  if (0 < iVar8) {
    lVar7 = (uVar9 & 0xffffffff) + 1;
    do {
      acStack_13a[1] = acStack_13a[lVar7];
      std::__ostream_insert<char,std::char_traits<char>>(os,acStack_13a + 1,1);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }